

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subquery_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::SubqueryExpression::Copy(SubqueryExpression *this)

{
  SubqueryType SVar1;
  ExpressionType EVar2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var6;
  SubqueryExpression *this_00;
  pointer pSVar7;
  pointer pSVar8;
  pointer pPVar9;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_38;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_28;
  
  this_00 = (SubqueryExpression *)operator_new(0x58);
  SubqueryExpression(this_00);
  local_38._M_head_impl = this_00;
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_38);
  (pSVar7->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pSVar7->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pSVar7->super_ParsedExpression).super_BaseExpression.alias);
  (pSVar7->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  pSVar8 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)(in_RSI + 0x38));
  (*(pSVar8->super_SQLStatement)._vptr_SQLStatement[3])(&local_28,pSVar8);
  _Var6._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (SelectStatement *)0x0;
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_38);
  _Var3._M_head_impl =
       (pSVar7->subquery).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pSVar7->subquery).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var3._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))();
  }
  if (local_28._M_head_impl != (SelectStatement *)0x0) {
    (*((local_28._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  local_28._M_head_impl = (SelectStatement *)0x0;
  SVar1 = *(SubqueryType *)(in_RSI + 0x40);
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_38);
  pSVar7->subquery_type = SVar1;
  if (*(long *)(in_RSI + 0x48) == 0) {
    local_30._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0x48));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_30,pPVar9);
  }
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_38);
  _Var5._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (ParsedExpression *)0x0;
  _Var4._M_head_impl =
       (pSVar7->child).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar7->child).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    if (local_30._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  EVar2 = *(ExpressionType *)(in_RSI + 0x50);
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_38);
  pSVar7->comparison_type = EVar2;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> SubqueryExpression::Copy() const {
	auto copy = make_uniq<SubqueryExpression>();
	copy->CopyProperties(*this);
	copy->subquery = unique_ptr_cast<SQLStatement, SelectStatement>(subquery->Copy());
	copy->subquery_type = subquery_type;
	copy->child = child ? child->Copy() : nullptr;
	copy->comparison_type = comparison_type;
	return std::move(copy);
}